

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioReadBlifMv.c
# Opt level: O2

int Io_MvParseLineNamesMv(Io_MvMod_t *p,char *pLine,int fReset)

{
  int *piVar1;
  char cVar2;
  Io_MvMan_t *pIVar3;
  Vec_Ptr_t *vTokens;
  Vec_Ptr_t *vTokens_00;
  Abc_Ntk_t *pNtk;
  Vec_Str_t *p_00;
  uint uVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  char *pcVar10;
  size_t sVar11;
  Abc_Obj_t *pAVar12;
  Abc_Obj_t *pFanin;
  int iVar13;
  byte *pOutput;
  int iVar14;
  ulong uVar15;
  int nInputs;
  char *pcVar16;
  
  pIVar3 = p->pMan;
  if (pIVar3->fBlifMv == 0) {
    __assert_fail("p->pMan->fBlifMv",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/io/ioReadBlifMv.c"
                  ,0x777,"int Io_MvParseLineNamesMv(Io_MvMod_t *, char *, int)");
  }
  vTokens = pIVar3->vTokens;
  vTokens_00 = pIVar3->vTokens2;
  pcVar16 = pLine + -1;
  do {
    pcVar10 = pcVar16;
    cVar2 = pcVar10[2];
    if (cVar2 == '\0') {
      pcVar16 = (char *)0x0;
      goto LAB_002987f2;
    }
    pcVar16 = pcVar10 + 1;
  } while ((cVar2 != '>') || (pcVar10[1] != '-'));
  pcVar16[0] = ' ';
  pcVar16[1] = ' ';
  pIVar3 = p->pMan;
  if (pIVar3->fBlifMv == 0) {
    uVar5 = Io_MvGetLine(pIVar3,pLine);
    sprintf(pIVar3->sError,"Line %d: Multi-output node symbol (->) in binary BLIF file.",
            (ulong)uVar5);
    return 0;
  }
LAB_002987f2:
  Io_MvSplitIntoTokens(vTokens,pLine,'\0');
  pcVar10 = (char *)Vec_PtrEntry(vTokens,0);
  if (fReset == 0) {
    iVar6 = strcmp(pcVar10,"names");
    if (iVar6 != 0) {
      pcVar10 = (char *)Vec_PtrEntry(vTokens,0);
      iVar6 = strcmp(pcVar10,"table");
      if (iVar6 != 0) {
        __assert_fail("!strcmp((char *)Vec_PtrEntry(vTokens,0), \"names\") || !strcmp((char *)Vec_PtrEntry(vTokens,0), \"table\")"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/io/ioReadBlifMv.c"
                      ,0x784,"int Io_MvParseLineNamesMv(Io_MvMod_t *, char *, int)");
      }
    }
  }
  else if ((*pcVar10 != 'r') || (pcVar10[1] != '\0')) {
    pcVar10 = (char *)Vec_PtrEntry(vTokens,0);
    iVar6 = strcmp(pcVar10,"reset");
    if (iVar6 != 0) {
      __assert_fail("!strcmp((char *)Vec_PtrEntry(vTokens,0), \"r\") || !strcmp((char *)Vec_PtrEntry(vTokens,0), \"reset\")"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/io/ioReadBlifMv.c"
                    ,0x782,"int Io_MvParseLineNamesMv(Io_MvMod_t *, char *, int)");
    }
  }
  nInputs = vTokens->nSize + -2;
  uVar5 = 1;
  iVar6 = nInputs;
  uVar4 = 1;
  if (cVar2 != '\0') {
    for (; uVar5 = uVar4, 0 < iVar6; iVar6 = iVar6 + -1) {
      pcVar10 = (char *)Vec_PtrEntry(vTokens,iVar6);
      nInputs = nInputs - (uint)(pcVar16 < pcVar10);
      uVar4 = uVar5 + (pcVar16 < pcVar10);
    }
  }
  pcVar16 = (char *)Vec_PtrEntryLast(vTokens);
  sVar11 = strlen(pcVar16);
  pOutput = (byte *)(pcVar16 + sVar11);
  do {
    uVar15 = (ulong)*pOutput;
    if (uVar15 < 0x2f) {
      if ((0x100002600U >> (uVar15 & 0x3f) & 1) == 0) {
        if ((uVar15 == 0x2e) && (pOutput[1] != 100)) break;
      }
      else {
        *pOutput = 0;
      }
    }
    pOutput = pOutput + 1;
  } while( true );
  Io_MvCollectTokens(vTokens_00,pcVar16 + sVar11,(char *)pOutput);
  pcVar10 = (char *)Vec_PtrEntry(vTokens_00,0);
  if (*pcVar10 == '.') {
    if (pcVar10[1] != 'd') {
      __assert_fail("pFirst[1] == \'d\'",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/io/ioReadBlifMv.c"
                    ,0x797,"int Io_MvParseLineNamesMv(Io_MvMod_t *, char *, int)");
    }
    iVar6 = ~uVar5 + vTokens_00->nSize;
  }
  else {
    iVar6 = vTokens_00->nSize;
  }
  iVar13 = nInputs + uVar5;
  if (iVar6 % iVar13 == 0) {
    if ((nInputs == 0) && (1 < iVar6 / iVar13)) {
      for (iVar6 = -uVar5; iVar6 != 0; iVar6 = iVar6 + 1) {
        pcVar16 = (char *)Vec_PtrEntry(vTokens,vTokens->nSize + iVar6);
        pAVar12 = Abc_NtkFindOrCreateNet(p->pNtk,pcVar16);
        if (fReset != 0) {
          if (p->pResetLatch == (Abc_Obj_t *)0x0) {
            __assert_fail("p->pResetLatch != NULL",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/io/ioReadBlifMv.c"
                          ,0x7ae,"int Io_MvParseLineNamesMv(Io_MvMod_t *, char *, int)");
          }
          pAVar12 = Io_MvParseAddResetCircuit(p,pcVar16);
        }
        piVar1 = &p->pMan->nNDnodes;
        *piVar1 = *piVar1 + 1;
        pFanin = Abc_NtkCreateNodeConst0(p->pNtk);
        Abc_ObjAddFanin(pAVar12,pFanin);
      }
    }
    else {
      iVar7 = 0;
      iVar6 = 0;
      if (0 < nInputs) {
        iVar6 = nInputs;
      }
      for (; iVar7 - uVar5 != 0; iVar7 = iVar7 + 1) {
        pcVar16 = (char *)Vec_PtrEntry(vTokens,(iVar7 - uVar5) + vTokens->nSize);
        if (fReset == 0) {
          pAVar12 = Abc_NtkFindOrCreateNet(p->pNtk,pcVar16);
          if (0 < (pAVar12->vFanins).nSize) {
            pIVar3 = p->pMan;
            uVar5 = Io_MvGetLine(pIVar3,pcVar16);
            pcVar10 = "Line %d: Signal \"%s\" is defined more than once.";
            goto LAB_0029897d;
          }
          pAVar12 = Io_ReadCreateNode(p->pNtk,pcVar16,(char **)(vTokens->pArray + 1),nInputs);
        }
        else {
          pAVar12 = Abc_NtkFindNet(p->pNtk,pcVar16);
          if (pAVar12 == (Abc_Obj_t *)0x0) {
            pIVar3 = p->pMan;
            uVar5 = Io_MvGetLine(pIVar3,pcVar16);
            pcVar10 = "Line %d: Latch with output signal \"%s\" does not exist.";
            goto LAB_0029897d;
          }
          pAVar12 = Io_MvParseAddResetCircuit(p,pcVar16);
          pNtk = p->pNtk;
          pcVar16 = Abc_ObjName(pAVar12);
          pAVar12 = Io_ReadCreateNode(pNtk,pcVar16,(char **)(vTokens->pArray + 1),nInputs);
          if (vTokens->nSize + -2 != nInputs) {
            __assert_fail("nInputs == Vec_PtrSize(vTokens) - 2",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/io/ioReadBlifMv.c"
                          ,0x750,
                          "int Io_MvParseLineNamesMvOne(Io_MvMod_t *, Vec_Ptr_t *, Vec_Ptr_t *, int, int, int, int)"
                         );
          }
        }
        p_00 = p->pMan->vFunc;
        p_00->nSize = 0;
        pcVar16 = (char *)Vec_PtrEntry(vTokens_00,0);
        iVar14 = 0;
        if (*pcVar16 == '.') {
          Vec_StrPush(p_00,'d');
          pcVar16 = (char *)Vec_PtrEntry(vTokens_00,iVar7 + 1);
          iVar8 = Io_MvParseLiteralMv(p,pAVar12,pcVar16,p_00,-1);
          iVar14 = uVar5 + 1;
          if (iVar8 == 0) {
LAB_00298bfe:
            (pAVar12->field_5).pData = (void *)0x0;
            return 0;
          }
        }
        while (iVar14 < vTokens_00->nSize) {
          iVar8 = 0;
          while (iVar6 != iVar8) {
            pcVar16 = (char *)Vec_PtrEntry(vTokens_00,iVar8 + iVar14);
            iVar9 = Io_MvParseLiteralMv(p,pAVar12,pcVar16,p_00,iVar8);
            iVar8 = iVar8 + 1;
            if (iVar9 == 0) goto LAB_00298bfe;
          }
          pcVar16 = (char *)Vec_PtrEntry(vTokens_00,iVar7 + nInputs + iVar14);
          iVar8 = Io_MvParseLiteralMv(p,pAVar12,pcVar16,p_00,-1);
          iVar14 = iVar14 + iVar13;
          if (iVar8 == 0) goto LAB_00298bfe;
        }
        Vec_StrPush(p_00,'\0');
        pcVar16 = p_00->pArray;
        (pAVar12->field_5).pData = pcVar16;
        if (pcVar16 == (char *)0x0) {
          return 0;
        }
        pcVar16 = Abc_SopRegister((Mem_Flex_t *)p->pNtk->pManFunc,pcVar16);
        (pAVar12->field_5).pData = pcVar16;
      }
    }
    iVar6 = 1;
  }
  else {
    pIVar3 = p->pMan;
    uVar5 = Io_MvGetLine(pIVar3,pcVar10);
    pcVar10 = 
    "Line %d: Wrong number of literals in the table of node \"%s\". (Spaces inside literals are not allowed.)"
    ;
LAB_0029897d:
    iVar6 = 0;
    sprintf(pIVar3->sError,pcVar10,(ulong)uVar5,pcVar16);
  }
  return iVar6;
}

Assistant:

static int Io_MvParseLineNamesMv( Io_MvMod_t * p, char * pLine, int fReset )
{
    Vec_Ptr_t * vTokens = p->pMan->vTokens;
    Vec_Ptr_t * vTokens2 = p->pMan->vTokens2;
    Abc_Obj_t * pNet;
    char * pName, * pFirst, * pArrow;
    int nInputs, nOutputs, nLiterals, nLines, i;
    assert( p->pMan->fBlifMv );
    // get the arrow if it is present
    pArrow = Io_MvFindArrow( pLine );
    if ( !p->pMan->fBlifMv && pArrow ) 
    {
        sprintf( p->pMan->sError, "Line %d: Multi-output node symbol (->) in binary BLIF file.", Io_MvGetLine(p->pMan, pLine) );
        return 0;
    }
    // split names line into tokens
    Io_MvSplitIntoTokens( vTokens, pLine, '\0' );
    if ( fReset )
        assert( !strcmp((char *)Vec_PtrEntry(vTokens,0), "r") || !strcmp((char *)Vec_PtrEntry(vTokens,0), "reset") );
    else
        assert( !strcmp((char *)Vec_PtrEntry(vTokens,0), "names") || !strcmp((char *)Vec_PtrEntry(vTokens,0), "table") );
    // find the number of inputs and outputs
    nInputs  = Vec_PtrSize(vTokens) - 2;
    nOutputs = 1;
    if ( pArrow != NULL )
    {
        for ( i = Vec_PtrSize(vTokens) - 2; i >= 1; i-- )
            if ( pArrow < (char*)Vec_PtrEntry(vTokens,i) )
            {
                nInputs--;
                nOutputs++;
            }
    }
    // split table into tokens
    pName = (char *)Vec_PtrEntryLast( vTokens );
    Io_MvSplitIntoTokensMv( vTokens2, pName + strlen(pName) );
    pFirst = (char *)Vec_PtrEntry( vTokens2, 0 );
    if ( pFirst[0] == '.' )
    {
        assert( pFirst[1] == 'd' );
        nLiterals = Vec_PtrSize(vTokens2) - 1 - nOutputs;
    }
    else
        nLiterals = Vec_PtrSize(vTokens2);
    // check the number of lines
    if ( nLiterals % (nInputs + nOutputs) != 0 )
    {
        sprintf( p->pMan->sError, "Line %d: Wrong number of literals in the table of node \"%s\". (Spaces inside literals are not allowed.)", Io_MvGetLine(p->pMan, pFirst), pName );
        return 0;
    }
    // check for the ND table
    nLines = nLiterals / (nInputs + nOutputs);
    if ( nInputs == 0 && nLines > 1 )
    {
        // add the outputs to the PIs
        for ( i = 0; i < nOutputs; i++ )
        {
            pName = (char *)Vec_PtrEntry( vTokens, Vec_PtrSize(vTokens) - nOutputs + i );
            // get the net corresponding to this node
            pNet = Abc_NtkFindOrCreateNet(p->pNtk, pName);
            if ( fReset )
            {
                assert( p->pResetLatch != NULL );
                // construct the reset circuit and get the reset net feeding into it
                pNet = Io_MvParseAddResetCircuit( p, pName );
            }
            // add the new PI node
//            Abc_ObjAddFanin( pNet, Abc_NtkCreatePi(p->pNtk) );
//            fprintf( stdout, "Io_ReadBlifMv(): Adding PI for internal non-deterministic node \"%s\".\n", pName );
            p->pMan->nNDnodes++;
            Abc_ObjAddFanin( pNet, Abc_NtkCreateNodeConst0(p->pNtk) );
        }
        return 1;
    }
    // iterate through the outputs
    for ( i = 0; i < nOutputs; i++ )
    {
        if ( !Io_MvParseLineNamesMvOne( p, vTokens, vTokens2, nInputs, nOutputs, i, fReset ) )
            return 0;
    }
    return 1;
}